

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionEuler.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChBeamSectionRayleighAdvancedGeneric::ComputeQuadraticTerms
          (ChBeamSectionRayleighAdvancedGeneric *this,ChVector<double> *mF,ChVector<double> *mT,
          ChVector<double> *mW)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  
  dVar1 = mW->m_data[2];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = dVar1;
  dVar2 = (this->super_ChBeamSectionEulerAdvancedGeneric).Mz;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar2;
  dVar3 = mW->m_data[0];
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar3;
  dVar6 = mW->m_data[1];
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar6;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar2 * dVar3;
  auVar20 = vfmsub213sd_fma(ZEXT816(0) << 0x40,auVar7,auVar22);
  dVar2 = (this->super_ChBeamSectionEulerAdvancedGeneric).mu;
  dVar4 = (this->super_ChBeamSectionEulerAdvancedGeneric).My;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar4;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = dVar4 * dVar1;
  auVar11 = vfmsub231sd_fma(auVar27,auVar19,auVar11);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = auVar11._0_8_ * dVar6;
  auVar9 = vfmsub231sd_fma(auVar12,auVar15,auVar20);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar6 * -0.0;
  auVar5 = vfmadd231sd_fma(auVar28,auVar15,auVar25);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = auVar5._0_8_ * dVar3;
  auVar11 = vfmsub231sd_fma(auVar16,auVar7,auVar11);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = auVar20._0_8_ * dVar1;
  auVar5 = vfmsub231sd_fma(auVar8,auVar19,auVar5);
  dVar6 = dVar2 * auVar5._0_8_;
  mF->m_data[0] = dVar6;
  mF->m_data[1] = dVar2 * auVar11._0_8_;
  mF->m_data[2] = dVar2 * auVar9._0_8_;
  (*(this->super_ChBeamSectionEulerAdvancedGeneric).super_ChBeamSectionEuler.super_ChBeamSection.
    _vptr_ChBeamSection[0xc])();
  auVar13._8_8_ = 0;
  auVar13._0_8_ =
       (this->super_ChBeamSectionEulerAdvancedGeneric).super_ChBeamSectionEuler.JzzJyy_factor;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = (this->super_ChBeamSectionEulerAdvancedGeneric).mu;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = this->Jyy;
  auVar5 = vfmadd231sd_fma(auVar20,auVar13,auVar17);
  dVar1 = mW->m_data[0];
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar1;
  dVar2 = mW->m_data[1];
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar2;
  dVar3 = mW->m_data[2];
  auVar26._8_8_ = 0;
  auVar26._0_8_ = dVar3;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = dVar3 * this->Jyz;
  auVar20 = vfmsub231sd_fma(auVar29,auVar24,auVar5);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar6 * dVar1 * dVar2;
  auVar11 = vfmsub231sd_fma(auVar21,auVar23,auVar20);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = this->Jzz;
  auVar5 = vfmadd213sd_fma(auVar17,auVar13,auVar5);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar2 * this->Jyz;
  auVar5 = vfmsub231sd_fma(auVar14,auVar26,auVar5);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = dVar6 * dVar1;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = auVar5._0_8_ * dVar1;
  auVar9 = vfmsub231sd_fma(auVar18,auVar26,auVar9);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = auVar20._0_8_ * dVar3;
  auVar5 = vfmsub231sd_fma(auVar10,auVar24,auVar5);
  mT->m_data[0] = auVar5._0_8_;
  mT->m_data[1] = auVar9._0_8_;
  mT->m_data[2] = auVar11._0_8_;
  return;
}

Assistant:

void ChBeamSectionRayleighAdvancedGeneric::ComputeQuadraticTerms(ChVector<>& mF,   ///< centrifugal term (if any) returned here
		ChVector<>& mT,                ///< gyroscopic term  returned here
		const ChVector<>& mW           ///< current angular velocity of section, in material frame
	) {
		 // F_centrifugal = density_per_unit_length w X w X c 
		mF = this->mu * Vcross(mW,Vcross(mW,ChVector<>(0,this->My,this->Mz)));

		// unroll the product [J] * w  in the expression w X [J] * w  as 4 values of [J] are zero anyway
		mT = Vcross(mW, ChVector<>( this->GetInertiaJxxPerUnitLength()*mW.x(),
									(this->Jyy + JzzJyy_factor * this->mu)*mW.y() - this->Jyz*mW.z(),
									(this->Jzz + JzzJyy_factor * this->mu)*mW.z() - this->Jyz*mW.y() )  );
	}